

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_external_partition_test.cc
# Opt level: O0

aom_ext_part_status_t
anon_unknown.dwarf_87c1cb::ext_part_create_model
          (void *priv,aom_ext_part_config_t *part_config,aom_ext_part_model_t *ext_part_model)

{
  bool bVar1;
  AssertHelper *pAVar2;
  undefined8 *in_RDX;
  ToyModel *in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  ToyModel *toy_model;
  AssertionResult gtest_ar;
  TestData *received_data;
  AssertHelper *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  AssertHelper *rhs_expression;
  char *in_stack_ffffffffffffff38;
  int iVar3;
  char *in_stack_ffffffffffffff40;
  Type in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar4;
  AssertionResult local_a8 [2];
  undefined8 local_88;
  AssertionResult local_80;
  undefined1 local_69;
  AssertHelper *in_stack_ffffffffffffff98;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertHelper *pAVar5;
  AssertionResult local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  undefined8 *local_20;
  aom_ext_part_status_t local_4;
  
  local_28._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI;
  local_20 = in_RDX;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (int *)in_stack_ffffffffffffff20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_38);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    in_stack_ffffffffffffff38 =
         testing::AssertionResult::failure_message((AssertionResult *)0x74d28d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),in_stack_ffffffffffffff30);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffa0,(Message *)in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
    testing::Message::~Message((Message *)0x74d2ea);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x74d35b);
  pAVar2 = (AssertHelper *)operator_new(0x60,(nothrow_t *)&std::nothrow);
  local_69 = pAVar2 != (AssertHelper *)0x0;
  rhs_expression = (AssertHelper *)0x0;
  if ((bool)local_69) {
    rhs_expression = pAVar2;
    in_stack_ffffffffffffff98 = pAVar2;
  }
  if (rhs_expression == (AssertHelper *)0x0) {
    local_88 = 0;
    pAVar5 = rhs_expression;
    testing::internal::CmpHelperNE<(anonymous_namespace)::ToyModel*,decltype(nullptr)>
              (in_stack_ffffffffffffff38,(char *)0x0,(ToyModel **)pAVar2,
               &in_stack_ffffffffffffff20->data_);
    iVar3 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_80);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      pAVar2 = (AssertHelper *)
               testing::AssertionResult::failure_message((AssertionResult *)0x74d424);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,iVar3,(char *)rhs_expression);
      testing::internal::AssertHelper::operator=(pAVar5,(Message *)in_stack_ffffffffffffff98);
      testing::internal::AssertHelper::~AssertHelper(pAVar2);
      testing::Message::~Message((Message *)0x74d472);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x74d4d4);
    local_4 = AOM_EXT_PART_ERROR;
  }
  else {
    (((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)&rhs_expression->data_)->_M_t).
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = local_28._M_head_impl;
    *local_20 = rhs_expression;
    uVar4 = 0xc;
    pAVar5 = rhs_expression;
    testing::internal::EqHelper::Compare<int,_BLOCK_SIZE,_nullptr>
              (in_stack_ffffffffffffff38,(char *)rhs_expression,(int *)pAVar2,
               (BLOCK_SIZE *)in_stack_ffffffffffffff20);
    iVar3 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_ffffffffffffff50));
      testing::AssertionResult::failure_message((AssertionResult *)0x74d56e);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(uVar4,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c
                 ,in_stack_ffffffffffffff40,iVar3,(char *)rhs_expression);
      testing::internal::AssertHelper::operator=(pAVar5,(Message *)in_stack_ffffffffffffff98);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
      testing::Message::~Message((Message *)0x74d5ba);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x74d61c);
    local_4 = AOM_EXT_PART_OK;
  }
  return local_4;
}

Assistant:

aom_ext_part_status_t ext_part_create_model(
    void *priv, const aom_ext_part_config_t *part_config,
    aom_ext_part_model_t *ext_part_model) {
  TestData *received_data = reinterpret_cast<TestData *>(priv);
  EXPECT_EQ(received_data->version, kVersion);
  ToyModel *toy_model = new (std::nothrow) ToyModel;
  if (toy_model == nullptr) {
    EXPECT_NE(toy_model, nullptr);
    return AOM_EXT_PART_ERROR;
  }
  toy_model->data = received_data;
  *ext_part_model = toy_model;
  EXPECT_EQ(part_config->superblock_size, BLOCK_64X64);
  return AOM_EXT_PART_OK;
}